

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  TestInfo *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string kIndent;
  string kTestsuite;
  TestResult *result;
  TestInfo *in_stack_fffffffffffffab8;
  TestResult *in_stack_fffffffffffffac0;
  size_t in_stack_fffffffffffffae8;
  allocator<char> *in_stack_fffffffffffffaf0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffaf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined8 in_stack_fffffffffffffb98;
  undefined1 uVar5;
  string *in_stack_fffffffffffffba0;
  TestResult *in_stack_fffffffffffffba8;
  string *value;
  int value_00;
  string *in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  string local_3c8 [16];
  TestResult *in_stack_fffffffffffffc48;
  ostream *in_stack_fffffffffffffc50;
  allocator<char> local_3a1;
  string local_3a0 [8];
  TimeInMillis in_stack_fffffffffffffc68;
  allocator<char> local_379;
  string local_378 [32];
  string local_358 [39];
  allocator<char> local_331;
  string local_330 [32];
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [16];
  TimeInMillis in_stack_fffffffffffffd28;
  allocator<char> local_2c1;
  string local_2c0 [39];
  allocator<char> local_299;
  string local_298 [39];
  allocator<char> local_271;
  string local_270 [39];
  allocator<char> local_249;
  string local_248 [36];
  undefined4 local_224;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [39];
  undefined1 local_1a9 [40];
  undefined1 local_181 [40];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  TestResult *local_20;
  TestInfo *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  uVar5 = (undefined1)((ulong)in_stack_fffffffffffffb98 >> 0x38);
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = TestInfo::result(in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  std::allocator<char>::~allocator(&local_41);
  Indent_abi_cxx11_(in_stack_fffffffffffffae8);
  pbVar4 = local_8;
  Indent_abi_cxx11_(in_stack_fffffffffffffae8);
  poVar2 = std::operator<<((ostream *)pbVar4,local_98);
  std::operator<<(poVar2,"{\n");
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  TestInfo::name((TestInfo *)0x58e64e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  OutputJsonKey((ostream *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                in_stack_fffffffffffffbb0,(string *)in_stack_fffffffffffffba8,
                in_stack_fffffffffffffba0,(bool)uVar5);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pcVar3 = TestInfo::value_param(in_stack_fffffffffffffab8);
  if (pcVar3 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    TestInfo::value_param(in_stack_fffffffffffffab8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    OutputJsonKey((ostream *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                  in_stack_fffffffffffffbb0,(string *)in_stack_fffffffffffffba8,
                  in_stack_fffffffffffffba0,(bool)uVar5);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator(&local_131);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator(&local_109);
  }
  pcVar3 = TestInfo::type_param(in_stack_fffffffffffffab8);
  if (pcVar3 != (char *)0x0) {
    in_stack_fffffffffffffbc0 = local_8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    in_stack_fffffffffffffbb8 = (string *)TestInfo::type_param(in_stack_fffffffffffffab8);
    in_stack_fffffffffffffbb0 = (string *)local_181;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    OutputJsonKey((ostream *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                  in_stack_fffffffffffffbb0,(string *)in_stack_fffffffffffffba8,
                  in_stack_fffffffffffffba0,(bool)uVar5);
    std::__cxx11::string::~string((string *)(local_181 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_181);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator(&local_159);
  }
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    TestInfo::should_run(local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    OutputJsonKey((ostream *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                  in_stack_fffffffffffffbb0,(string *)in_stack_fffffffffffffba8,
                  in_stack_fffffffffffffba0,(bool)uVar5);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator(&local_271);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator(&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    bVar1 = TestInfo::should_run(local_18);
    if (bVar1) {
      TestResult::Skipped(in_stack_fffffffffffffac0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    OutputJsonKey((ostream *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                  in_stack_fffffffffffffbb0,(string *)in_stack_fffffffffffffba8,
                  in_stack_fffffffffffffba0,(bool)uVar5);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    std::__cxx11::string::~string(local_298);
    std::allocator<char>::~allocator(&local_299);
    pbVar4 = local_8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (pbVar4,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    pcVar3 = (char *)TestResult::start_timestamp(local_20);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(in_stack_fffffffffffffd28);
    OutputJsonKey((ostream *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                  in_stack_fffffffffffffbb0,(string *)in_stack_fffffffffffffba8,
                  in_stack_fffffffffffffba0,(bool)uVar5);
    std::__cxx11::string::~string(local_310);
    std::__cxx11::string::~string(local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
    __a = &local_331;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(pbVar4,pcVar3,__a);
    TestResult::elapsed_time(local_20);
    FormatTimeInMillisAsDuration_abi_cxx11_(in_stack_fffffffffffffc68);
    OutputJsonKey((ostream *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                  in_stack_fffffffffffffbb0,(string *)in_stack_fffffffffffffba8,
                  in_stack_fffffffffffffba0,(bool)uVar5);
    std::__cxx11::string::~string(local_358);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator(&local_331);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(pbVar4,pcVar3,__a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(pbVar4,pcVar3,__a);
    OutputJsonKey((ostream *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                  in_stack_fffffffffffffbb0,(string *)in_stack_fffffffffffffba8,
                  in_stack_fffffffffffffba0,(bool)uVar5);
    std::__cxx11::string::~string(local_3a0);
    std::allocator<char>::~allocator(&local_3a1);
    std::__cxx11::string::~string(local_378);
    std::allocator<char>::~allocator(&local_379);
    TestPropertiesAsJson(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    std::operator<<((ostream *)local_8,local_3c8);
    std::__cxx11::string::~string(local_3c8);
    OutputJsonTestResult(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    local_224 = 0;
  }
  else {
    value = (string *)local_1a9;
    pbVar4 = local_8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    pcVar3 = TestInfo::file((TestInfo *)0x58ebc7);
    uVar5 = (undefined1)((ulong)pcVar3 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    OutputJsonKey((ostream *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                  in_stack_fffffffffffffbb0,value,pbVar4,(bool)uVar5);
    value_00 = (int)((ulong)value >> 0x20);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::__cxx11::string::~string((string *)(local_1a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    TestInfo::line(local_18);
    OutputJsonKey((ostream *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                  in_stack_fffffffffffffbb0,value_00,pbVar4,(bool)uVar5);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    poVar2 = std::operator<<((ostream *)local_8,"\n");
    Indent_abi_cxx11_(in_stack_fffffffffffffae8);
    poVar2 = std::operator<<(poVar2,local_220);
    std::operator<<(poVar2,"}");
    std::__cxx11::string::~string(local_220);
    local_224 = 1;
  }
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestInfo(::std::ostream* stream,
                                                   const char* test_suite_name,
                                                   const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";
  const std::string kIndent = Indent(10);

  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_info.name(), kIndent);

  if (test_info.value_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "value_param", test_info.value_param(),
                  kIndent);
  }
  if (test_info.type_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "type_param", test_info.type_param(),
                  kIndent);
  }
  if (GTEST_FLAG_GET(list_tests)) {
    OutputJsonKey(stream, kTestsuite, "file", test_info.file(), kIndent);
    OutputJsonKey(stream, kTestsuite, "line", test_info.line(), kIndent, false);
    *stream << "\n" << Indent(8) << "}";
    return;
  }

  OutputJsonKey(stream, kTestsuite, "status",
                test_info.should_run() ? "RUN" : "NOTRUN", kIndent);
  OutputJsonKey(stream, kTestsuite, "result",
                test_info.should_run()
                    ? (result.Skipped() ? "SKIPPED" : "COMPLETED")
                    : "SUPPRESSED",
                kIndent);
  OutputJsonKey(stream, kTestsuite, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuite, "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()), kIndent);
  OutputJsonKey(stream, kTestsuite, "classname", test_suite_name, kIndent,
                false);
  *stream << TestPropertiesAsJson(result, kIndent);

  OutputJsonTestResult(stream, result);
}